

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O3

void bcm2835_gpio_set(uint8_t pin)

{
  if (debug != '\0') {
    printf("bcm2835_peri_write paddr %p, value %08X\n");
    return;
  }
  bcm2835_gpio[(ulong)(pin >> 5) + 7] = 1 << (pin & 0x1f);
  return;
}

Assistant:

void bcm2835_gpio_set(uint8_t pin)
{
    volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPSET0/4 + pin/32;
    uint8_t shift = pin % 32;
    bcm2835_peri_write(paddr, 1 << shift);
}